

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O0

void __thiscall QHybrid::ComputeWithCachedQValues(QHybrid *this,bool computeIfNotCached)

{
  byte bVar1;
  ostream *poVar2;
  char *pcVar3;
  E *this_00;
  string *arg;
  byte in_SIL;
  long *in_RDI;
  stringstream ss_1;
  ifstream fp;
  stringstream ss;
  bool cached;
  string filenameCache;
  stringstream local_580 [16];
  ostream local_570 [376];
  string local_3f8 [32];
  long local_3d8 [67];
  stringstream local_1c0 [16];
  ostream local_1b0 [383];
  byte local_31;
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x40))
            (local_30,(long)in_RDI + *(long *)(*in_RDI + -0x88));
  local_31 = 1;
  std::__cxx11::stringstream::stringstream(local_1c0);
  poVar2 = std::operator<<(local_1b0,local_30);
  std::operator<<(poVar2,"_firstTS");
  std::__cxx11::stringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_3d8,pcVar3,_S_in);
  std::__cxx11::string::~string(local_3f8);
  bVar1 = std::ios::operator!((ios *)((long)local_3d8 + *(long *)(local_3d8[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    local_31 = 0;
  }
  std::ifstream::~ifstream(local_3d8);
  std::__cxx11::stringstream::~stringstream(local_1c0);
  if (((local_31 & 1) == 0) && ((local_9 & 1) == 0)) {
    std::__cxx11::stringstream::stringstream(local_580);
    poVar2 = std::operator<<(local_570,"QHybrid::ComputeWithCachedQValues: Q function ");
    this_00 = (E *)std::operator<<(poVar2,local_30);
    std::operator<<((ostream *)this_00," not cached, bailing out");
    arg = (string *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    E::E(this_00,arg);
    __cxa_throw(arg,&E::typeinfo,E::~E);
  }
  if ((local_31 & 1) == 0) {
    (**(code **)(*in_RDI + 0x10))();
    (**(code **)(*in_RDI + 0x38))(in_RDI,local_30);
  }
  else {
    (**(code **)(*in_RDI + 0x28))(in_RDI,local_30);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void QHybrid::ComputeWithCachedQValues(bool computeIfNotCached)
{
    string filenameCache=GetCacheFilename();

    // check whether both files exist
    bool cached=true;
    {
        stringstream ss;
        ss << filenameCache << "_firstTS";
        ifstream fp(ss.str().c_str());
        if(!fp)
            cached=false;
    }

    if(!cached && !computeIfNotCached)
    {
        stringstream ss;
        ss << "QHybrid::ComputeWithCachedQValues: Q function "
           << filenameCache << " not cached, bailing out";
        throw(E(ss.str()));
        return;
    }

    // Couldn't open cache file, so compute
    if(!cached)
    {
        Compute();
        Save(filenameCache);
    }
    else // load Q values from file
        Load(filenameCache);
}